

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O2

void __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::second_stage
          (deregistration_processor_t *this)

{
  pointer psVar1;
  
  psVar1 = (this->m_coops_to_dereg).
           super__Vector_base<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  coop_t::do_deregistration_specific_actions
            ((psVar1->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (coop_dereg_reason_t)(this->m_root_coop_dereg_reason).m_reason);
  while (psVar1 = psVar1 + 1,
        psVar1 != (this->m_coops_to_dereg).
                  super__Vector_base<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    coop_t::do_deregistration_specific_actions
              ((psVar1->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (coop_dereg_reason_t)0x2);
  }
  return;
}

Assistant:

void
deregistration_processor_t::second_stage()
{
	// Exceptions must lead to abort at this deregistration stage.
	try
	{
		// All cooperations should start deregistration actions.
		auto it = m_coops_to_dereg.begin();

		// The first item in that vector is a root cooperation.
		// So the actual coop_dereg_reason should be used for it.
		coop_private_iface_t::do_deregistration_specific_actions(
				**it, std::move( m_root_coop_dereg_reason ) );

		// A special value must be used for all other coops.
		for(++it; it != m_coops_to_dereg.end(); ++it )
		{
			coop_private_iface_t::do_deregistration_specific_actions(
					**it,
					coop_dereg_reason_t( dereg_reason::parent_deregistration ) );
		}
	}
	catch( const std::exception & x )
	{
		initiate_abort_on_exception( x );
	}
}